

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter.hxx
# Opt level: O0

StateVector * __thiscall
stateObservation::compileTime::KalmanFilter<4U,_3U,_2U>::prediction_
          (StateVector *__return_storage_ptr__,KalmanFilter<4U,_3U,_2U> *this,uint k)

{
  undefined1 local_158 [16];
  MatrixT local_148;
  Product<Eigen::Matrix<double,_4,_2,_0,_4,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> local_108;
  MatrixT local_f8;
  MatrixT local_d8;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> local_58;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_4,_2,_0,_4,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
  local_48;
  uint local_1c;
  KalmanFilter<4U,_3U,_2U> *pKStack_18;
  uint k_local;
  KalmanFilter<4U,_3U,_2U> *this_local;
  
  local_1c = k;
  pKStack_18 = this;
  this_local = (KalmanFilter<4U,_3U,_2U> *)__return_storage_ptr__;
  IndexedMatrix<4U,_4U>::operator()(&local_d8,&(this->super_KalmanFilterBase<4U,_3U,_2U>).a_);
  IndexedMatrix<4U,_1U>::operator()
            (&local_f8,
             &(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_);
  local_58 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_d8,
                        (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_f8);
  IndexedMatrix<4U,_2U>::operator()(&local_148,&this->b_);
  std::
  deque<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
  ::operator[](&(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.u_,0)
  ;
  IndexedMatrix<2U,_1U>::operator()((IndexedMatrix<2U,_1U> *)local_158);
  local_108 = Eigen::MatrixBase<Eigen::Matrix<double,4,2,0,4,2>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,2,0,4,2>> *)&local_148,
                         (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_158);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>::
  operator+(&local_48,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
             *)&local_58,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,_4,_2,_0,_4,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
             *)&local_108);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::Product<Eigen::Matrix<double,4,2,0,4,2>,Eigen::Matrix<double,2,1,0,2,1>,0>const>>
            ((Matrix<double,4,1,0,4,1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_4,_2,_0,_4,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>_>
              *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilter<n,m,p>::prediction_(unsigned k)
{
    (void)k; //unused

    if (p>0)
        return this->a_()*this->x_()+this->b_()*this->u_[0]();
    else
        return typename ObserverBase<n,m,p>::StateVector(this->a_()*this->x_());

}